

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void copy_structdecl(char *kind,char *name)

{
  int lineno;
  int __c;
  char *line;
  char *pcVar1;
  FILE *local_48;
  char *u_cptr;
  char *u_line;
  int local_28;
  int u_lineno;
  int depth;
  int c;
  FILE *dc_file;
  char *name_local;
  char *kind_local;
  
  lineno = input_file->lineno;
  line = dup_line();
  pcVar1 = cptr + (-6 - (long)::line);
  if ((dflag != '\0') && (include_defines == '\0')) {
    fprintf((FILE *)text_file,"#include \"%s\"\n\n",defines_file_name);
    include_defines = '\x01';
  }
  if (dflag == '\0') {
    local_48 = (FILE *)text_file;
  }
  else {
    local_48 = (FILE *)union_file;
  }
  fprintf(local_48,"\n");
  if (lflag == '\0') {
    fprintf(local_48,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  fprintf(local_48,"typedef %s",kind);
  local_28 = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            __c = (int)*cptr;
            cptr = cptr + 1;
            putc(__c,local_48);
            if (__c != 10) break;
            get_line();
            if (::line == (char *)0x0) {
              unterminated_union(lineno,line,line + (long)pcVar1);
            }
          }
          if ((__c != 0x22) && (__c != 0x27)) break;
          copy_string(__c,(FILE *)local_48,(FILE *)0x0);
        }
        if (__c != 0x2f) break;
        copy_comment((FILE *)local_48,(FILE *)0x0);
      }
      if (__c != 0x7b) break;
      local_28 = local_28 + 1;
    }
  } while ((__c != 0x7d) || (local_28 = local_28 + -1, local_28 != 0));
  fprintf(local_48," %s;\n",name);
  free(line);
  fprintf(local_48,"#define %s %s\n",name,name);
  return;
}

Assistant:

void copy_structdecl(const char *kind, const char *name)
{
    FILE *dc_file;
    register int c;
    int depth;
    int u_lineno = input_file->lineno;
    char *u_line = dup_line();
    char *u_cptr = u_line + (cptr - line - 6);

    if (dflag && !include_defines) {
	fprintf(text_file, "#include \"%s\"\n\n", defines_file_name);
	include_defines = 1; }

    /* VM: Print to either code file or defines file but not to both */
    dc_file = dflag ? union_file : text_file;
    fprintf(dc_file, "\n");
    if (!lflag)
	fprintf(dc_file, line_format, input_file->lineno, input_file->name);
    fprintf(dc_file, "typedef %s", kind);
    depth = 0;
loop:
    c = *cptr++;
    putc(c, dc_file);
    switch (c) {
    case '\n':
      get_line();
      if (line == 0) unterminated_union(u_lineno, u_line, u_cptr);
      goto loop;
    case '{':
      ++depth;
      goto loop;
    case '}':
      if (--depth == 0) {
	fprintf(dc_file, " %s;\n", name);
	FREE(u_line);
	break; }
      goto loop;
    case '\'':
    case '"':
      copy_string(c, dc_file, 0);
      goto loop;
    case '/':
      copy_comment(dc_file, 0);
      goto loop;
    default:
      goto loop;
    }
    fprintf(dc_file, "#define %s %s\n", name, name);
}